

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

node_t multiplicative_expression(void)

{
  uint id;
  node_t left;
  node_t right;
  char *pcVar1;
  int op;
  
  left = unary_expression();
  if (left == (node_t)0x0) {
LAB_00106197:
    left = (node_t)0x0;
  }
  else {
    while( true ) {
      id = t->id;
      if ((0x2f < (ulong)id) || ((0x842000000000U >> ((ulong)id & 0x3f) & 1) == 0)) break;
      last_id = id;
      t = get_token();
      eline = t->line;
      ecolumn = t->column;
      right = unary_expression();
      if (right == (node_t)0x0) {
        pcVar1 = token_name(id);
        err(E,"expected expression after %s ",pcVar1);
        goto LAB_00106197;
      }
      left = binop(id,left,right);
    }
  }
  return left;
}

Assistant:

node_t multiplicative_expression()
{
    node_t n = NULL;
    if ((n = cast_expression()))
    {
        while (t->id == '*' || t->id == '/' || t->id == '%')
        {
            node_t right = NULL;
            int op = t->id;
            next();
            if (!(right = cast_expression()))
            {
                err(E, "expected expression after %s ", token_name(op));
                return NULL;
            }

            n = binop(op, n, right);
        }
        return n;
    }
    return NULL;
}